

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWriteConvertedBox(FILE *pFile,Abc_Ntk_t *pNtk,int fSeq)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  char *pcVar5;
  int local_30;
  int local_2c;
  int v;
  int i;
  Abc_Obj_t *pObj;
  int fSeq_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  if (fSeq == 0) {
    fprintf((FILE *)pFile,".attrib white box comb\n");
    fprintf((FILE *)pFile,".delay 1\n");
  }
  else {
    fprintf((FILE *)pFile,".attrib white box seq\n");
  }
  for (local_2c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_2c);
    fprintf((FILE *)pFile,".names");
    Io_NtkWritePis(pFile,pNtk,1);
    if (fSeq == 0) {
      pAVar3 = Abc_ObjFanin0(pAVar2);
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf((FILE *)pFile," %s\n",pcVar4);
    }
    else {
      pAVar3 = Abc_ObjFanin0(pAVar2);
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf((FILE *)pFile," %s_in\n",pcVar4);
    }
    for (local_30 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_30 < iVar1; local_30 = local_30 + 1) {
      fprintf((FILE *)pFile,"1");
    }
    fprintf((FILE *)pFile," 1\n");
    if (fSeq != 0) {
      pAVar3 = Abc_ObjFanin0(pAVar2);
      pcVar4 = Abc_ObjName(pAVar3);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      pcVar5 = Abc_ObjName(pAVar2);
      fprintf((FILE *)pFile,".latch %s_in %s 1\n",pcVar4,pcVar5);
    }
  }
  return;
}

Assistant:

void Io_NtkWriteConvertedBox( FILE * pFile, Abc_Ntk_t * pNtk, int fSeq )
{
    Abc_Obj_t * pObj;
    int i, v;
    if ( fSeq )
    {
        fprintf( pFile, ".attrib white box seq\n" );
    }
    else
    {
        fprintf( pFile, ".attrib white box comb\n" );
        fprintf( pFile, ".delay 1\n" );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    { 
        // write the .names line
        fprintf( pFile, ".names" );
        Io_NtkWritePis( pFile, pNtk, 1 );
        if ( fSeq )
            fprintf( pFile, " %s_in\n", Abc_ObjName(Abc_ObjFanin0(pObj)) );
        else
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanin0(pObj)) );
        for ( v = 0; v < Abc_NtkPiNum(pNtk); v++ )
            fprintf( pFile, "1" );
        fprintf( pFile, " 1\n" );
        if ( fSeq )
            fprintf( pFile, ".latch %s_in %s 1\n", Abc_ObjName(Abc_ObjFanin0(pObj)), Abc_ObjName(Abc_ObjFanin0(pObj)) );
    }
}